

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_find_again(_glist *x)

{
  uint uVar1;
  uint uVar2;
  uint local_14;
  int found;
  int myindex;
  _glist *x_local;
  
  local_14 = 0;
  if ((*(long *)((pd_maininstance.pd_gui)->i_editor + 0x60) != 0) &&
     (canvas_whichfind != (_glist *)0x0)) {
    _found = x;
    uVar1 = canvas_dofind(canvas_whichfind,(int *)&local_14);
    uVar2 = *(int *)((pd_maininstance.pd_gui)->i_editor + 0x58) + 1;
    *(uint *)((pd_maininstance.pd_gui)->i_editor + 0x58) = uVar2;
    pdgui_vmess("pdtk_showfindresult","^ iii",_found,(ulong)uVar1,(ulong)uVar2,(ulong)local_14);
    if (uVar1 == 0) {
      *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x58) = 0;
    }
  }
  return;
}

Assistant:

static void canvas_find_again(t_canvas *x)
{
    int myindex = 0, found;
    if (!EDITOR->canvas_findbuf || !canvas_whichfind)
        return;
    found = canvas_dofind(canvas_whichfind, &myindex);
    pdgui_vmess("pdtk_showfindresult", "^ iii",
        x,
       found, ++EDITOR->canvas_find_index, myindex);
    if (!found)
        EDITOR->canvas_find_index = 0;
}